

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::MultiplyPropagateStatistics::Operation<long,duckdb::TryDecimalMultiply>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  int64_t value;
  long lVar4;
  int64_t value_00;
  long lVar5;
  long lVar6;
  bool bVar7;
  long rvals [2];
  long lvals [2];
  long local_98 [5];
  Value local_70;
  
  value = 0x7fffffffffffffff;
  local_98[2] = NumericStats::GetMin<long>(lstats);
  local_98[3] = NumericStats::GetMax<long>(lstats);
  local_98[0] = NumericStats::GetMin<long>(rstats);
  local_98[1] = NumericStats::GetMax<long>(rstats);
  value_00 = -0x8000000000000000;
  bVar7 = true;
  lVar1 = 0;
  do {
    bVar2 = false;
    lVar3 = 0;
    do {
      lVar5 = local_98[lVar3] * local_98[lVar1 + 2];
      lVar4 = value;
      if (lVar5 < value) {
        lVar4 = lVar5;
      }
      lVar6 = lVar5;
      if (lVar5 - value_00 == 0 || lVar5 < value_00) {
        lVar6 = value_00;
      }
      if (lVar5 + 0xf21f494c589c0000U < 0xe43e9298b1380001 ||
          SEXT816(lVar5) != SEXT816(local_98[lVar3]) * SEXT816(local_98[lVar1 + 2])) break;
      lVar3 = lVar3 + 1;
      bVar2 = lVar3 != 1;
      value = lVar4;
      value_00 = lVar6;
    } while (lVar3 == 1);
    if (!bVar2) break;
    bVar7 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar7);
  if (bVar7 == false) {
    Value::Numeric(&local_70,type,value);
    Value::operator=(new_min,&local_70);
    Value::~Value(&local_70);
    Value::Numeric(&local_70,type,value_00);
    Value::operator=(new_max,&local_70);
    Value::~Value(&local_70);
  }
  return bVar7;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}